

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::bt_peer_connection::on_extended(bt_peer_connection *this,int received)

{
  crypto_receive_buffer *this_00;
  long *plVar1;
  error_code_enum e;
  bool bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  piece_index_t index;
  _List_node_base *p_Var6;
  char *pcVar7;
  ulong uVar8;
  error_code *this_01;
  element_type *peVar9;
  span<const_char> sVar10;
  error_code local_58;
  _List_node_base *local_48;
  error_code local_40;
  
  this_01 = &local_58;
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  this_00 = &this->m_recv_buffer;
  iVar4 = crypto_receive_buffer::packet_size(this_00);
  if (1 < iVar4) {
    ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&local_58,
               &(this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.cat_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&local_58.cat_);
    }
    else {
      iVar4 = *(int *)&(local_58.cat_)->id_;
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&local_58.cat_);
      if (iVar4 != 0) {
        sVar10 = crypto_receive_buffer::get(this_00);
        if ((int)sVar10.m_len < 2) {
          return;
        }
        uVar8 = (ulong)(byte)sVar10.m_ptr[1];
        peVar9 = (element_type *)(sVar10.m_ptr + 2);
        local_58.cat_ = (error_category *)(sVar10.m_len + -2);
        local_58._0_8_ = peVar9;
        switch(uVar8) {
        case 0:
          on_extended_handshake(this);
          peer_connection::disconnect_if_redundant(&this->super_peer_connection);
          return;
        default:
          bVar2 = crypto_receive_buffer::packet_finished(this_00);
          if (bVar2) {
            uVar5 = crypto_receive_buffer::packet_size(this_00);
            peer_connection::peer_log
                      (&this->super_peer_connection,incoming_message,"EXTENSION_MESSAGE",
                       "msg: %d size: %d",uVar8,(ulong)uVar5);
          }
          p_Var6 = (_List_node_base *)&(this->super_peer_connection).m_extensions;
          local_48 = p_Var6;
          while (p_Var6 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                             *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
                p_Var6 != local_48) {
            plVar1 = (long *)p_Var6[1]._M_next;
            iVar4 = crypto_receive_buffer::packet_size(this_00);
            cVar3 = (**(code **)(*plVar1 + 0x130))(plVar1,iVar4 + -2,uVar8,peVar9,local_58.cat_);
            if (cVar3 != '\0') {
              return;
            }
          }
          this_01 = &local_40;
          e = invalid_message;
          goto LAB_0018894f;
        case 3:
          bVar2 = crypto_receive_buffer::packet_finished(this_00);
          if (!bVar2) {
            return;
          }
          iVar4 = crypto_receive_buffer::packet_size(this_00);
          if (iVar4 == 3) {
            bVar2 = *(char *)&peVar9->super_request_callback != '\0';
            pcVar7 = "false";
            if (bVar2) {
              pcVar7 = "true";
            }
            peer_connection::peer_log
                      (&this->super_peer_connection,incoming_message,"UPLOAD_ONLY","%s",pcVar7);
            peer_connection::set_upload_only(&this->super_peer_connection,bVar2);
            return;
          }
          uVar5 = crypto_receive_buffer::packet_size(this_00);
          pcVar7 = "UPLOAD_ONLY";
          break;
        case 4:
          bVar2 = crypto_receive_buffer::packet_finished(this_00);
          if (!bVar2) {
            return;
          }
          peer_connection::peer_log(&this->super_peer_connection,incoming_message,"HOLEPUNCH");
          on_holepunch(this);
          return;
        case 7:
          bVar2 = crypto_receive_buffer::packet_finished(this_00);
          if (!bVar2) {
            return;
          }
          iVar4 = crypto_receive_buffer::packet_size(this_00);
          if (iVar4 == 6) {
            index.m_val = read_impl<int,char_const>(&local_58);
            peer_connection::incoming_dont_have(&this->super_peer_connection,index);
            return;
          }
          uVar5 = crypto_receive_buffer::packet_size(this_00);
          pcVar7 = "DONT_HAVE";
          break;
        case 8:
          bVar2 = crypto_receive_buffer::packet_finished(this_00);
          if (!bVar2) {
            return;
          }
          iVar4 = crypto_receive_buffer::packet_size(this_00);
          if (iVar4 == 3) {
            bVar2 = *(char *)&peVar9->super_request_callback != '\0';
            pcVar7 = "false";
            if (bVar2) {
              pcVar7 = "true";
            }
            peer_connection::peer_log
                      (&this->super_peer_connection,incoming_message,"SHARE_MODE","%s",pcVar7);
            peer_connection::set_share_mode(&this->super_peer_connection,bVar2);
            return;
          }
          uVar5 = crypto_receive_buffer::packet_size(this_00);
          pcVar7 = "SHARE_MODE";
        }
        peer_connection::peer_log
                  (&this->super_peer_connection,incoming_message,pcVar7,
                   "ERROR: unexpected packet size: %d",(ulong)uVar5);
        return;
      }
    }
  }
  e = invalid_extended;
LAB_0018894f:
  boost::system::error_code::error_code<libtorrent::errors::error_code_enum>(this_01,e,(type *)0x0);
  (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
            (this,this_01,1,2);
  return;
}

Assistant:

void bt_peer_connection::on_extended(int received)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(received >= 0);
		received_bytes(0, received);
		if (m_recv_buffer.packet_size() < 2)
		{
			disconnect(errors::invalid_extended, operation_t::bittorrent, peer_error);
			return;
		}

		if (associated_torrent().expired())
		{
			disconnect(errors::invalid_extended, operation_t::bittorrent, peer_error);
			return;
		}

		span<char const> recv_buffer = m_recv_buffer.get();
		if (int(recv_buffer.size()) < 2) return;

		TORRENT_ASSERT(recv_buffer.front() == msg_extended);
		recv_buffer = recv_buffer.subspan(1);

		int const extended_id = aux::read_uint8(recv_buffer);

		if (extended_id == 0)
		{
			on_extended_handshake();
			disconnect_if_redundant();
			return;
		}

		if (extended_id == upload_only_msg)
		{
			if (!m_recv_buffer.packet_finished()) return;
			if (m_recv_buffer.packet_size() != 3)
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::incoming_message, "UPLOAD_ONLY"
					, "ERROR: unexpected packet size: %d", m_recv_buffer.packet_size());
#endif
				return;
			}
			bool const ul = aux::read_uint8(recv_buffer) != 0;
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming_message, "UPLOAD_ONLY"
				, "%s", (ul?"true":"false"));
#endif
			set_upload_only(ul);
			return;
		}

#ifndef TORRENT_DISABLE_SHARE_MODE
		if (extended_id == share_mode_msg)
		{
			if (!m_recv_buffer.packet_finished()) return;
			if (m_recv_buffer.packet_size() != 3)
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::incoming_message, "SHARE_MODE"
					, "ERROR: unexpected packet size: %d", m_recv_buffer.packet_size());
#endif
				return;
			}
			bool sm = aux::read_uint8(recv_buffer) != 0;
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming_message, "SHARE_MODE"
				, "%s", (sm?"true":"false"));
#endif
			set_share_mode(sm);
			return;
		}
#endif // TORRENT_DISABLE_SHARE_MODE

		if (extended_id == holepunch_msg)
		{
			if (!m_recv_buffer.packet_finished()) return;
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming_message, "HOLEPUNCH");
#endif
			on_holepunch();
			return;
		}

		if (extended_id == dont_have_msg)
		{
			if (!m_recv_buffer.packet_finished()) return;
			if (m_recv_buffer.packet_size() != 6)
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::incoming_message, "DONT_HAVE"
					, "ERROR: unexpected packet size: %d", m_recv_buffer.packet_size());
#endif
				return;
			}
			piece_index_t const piece(aux::read_int32(recv_buffer));
			incoming_dont_have(piece);
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (m_recv_buffer.packet_finished())
			peer_log(peer_log_alert::incoming_message, "EXTENSION_MESSAGE"
				, "msg: %d size: %d", extended_id, m_recv_buffer.packet_size());
#endif

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			if (e->on_extended(m_recv_buffer.packet_size() - 2, extended_id
				, recv_buffer))
				return;
		}
#endif

		disconnect(errors::invalid_message, operation_t::bittorrent, peer_error);
	}